

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxPrinter.cpp
# Opt level: O0

SyntaxPrinter * __thiscall slang::syntax::SyntaxPrinter::print(SyntaxPrinter *this,Trivia trivia)

{
  SyntaxNode *pSVar1;
  iterator pTVar2;
  undefined8 uVar3;
  string_view text;
  Token t_1;
  iterator __end4;
  iterator __begin4;
  span<const_slang::parsing::Token,_18446744073709551615UL> *local_78;
  span<const_slang::parsing::Token,_18446744073709551615UL> *__range4;
  undefined8 local_68;
  iterator local_60;
  Trivia *t;
  iterator __end5;
  iterator __begin5;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_38;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *local_28;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *__range5;
  SyntaxPrinter *this_local;
  Trivia trivia_local;
  
  uVar3 = trivia._8_8_;
  this_local = trivia.field_0._0_8_;
  trivia_local.field_0._5_1_ = trivia.kind;
  __range5 = (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)this;
  trivia_local.field_0.rawText.ptr = (char *)uVar3;
  switch(trivia_local.field_0._5_1_) {
  case 3:
  case 4:
    if ((this->includeComments & 1U) == 0) {
      return this;
    }
  default:
    text = parsing::Trivia::getRawText((Trivia *)&this_local);
    append(this,text);
    break;
  case 6:
    if ((this->includeSkipped & 1U) != 0) {
      ___begin4 = parsing::Trivia::getSkippedTokens((Trivia *)&this_local);
      local_78 = (span<const_slang::parsing::Token,_18446744073709551615UL> *)&__begin4;
      __end4 = nonstd::span_lite::span<const_slang::parsing::Token,_18446744073709551615UL>::begin
                         (local_78);
      pTVar2 = nonstd::span_lite::span<const_slang::parsing::Token,_18446744073709551615UL>::end
                         (local_78);
      for (; __end4 != pTVar2; __end4 = __end4 + 1) {
        print(this,*__end4);
      }
    }
    break;
  case 7:
    if ((this->includeSkipped & 1U) != 0) {
      pSVar1 = parsing::Trivia::syntax((Trivia *)&this_local);
      print(this,pSVar1);
    }
    break;
  case 8:
    if ((this->includeDirectives & 1U) == 0) {
      if ((this->includePreprocessed & 1U) != 0) {
        pSVar1 = parsing::Trivia::syntax((Trivia *)&this_local);
        ___begin5 = SyntaxNode::getFirstToken(pSVar1);
        local_38 = parsing::Token::trivia((Token *)&__begin5);
        local_28 = &local_38;
        __end5 = nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
                 begin(local_28);
        t = nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::end
                      (local_28);
        for (; __end5 != t; __end5 = __end5 + 1) {
          local_60 = __end5;
          __range4 = (span<const_slang::parsing::Token,_18446744073709551615UL> *)
                     (__end5->field_0).tokens.ptr;
          local_68 = *(undefined8 *)((long)&__end5->field_0 + 8);
          print(this,*__end5);
        }
      }
    }
    else {
      pSVar1 = parsing::Trivia::syntax((Trivia *)&this_local);
      print(this,pSVar1);
    }
  }
  return this;
}

Assistant:

SyntaxPrinter& SyntaxPrinter::print(Trivia trivia) {
    switch (trivia.kind) {
        case TriviaKind::Directive:
            if (includeDirectives)
                print(*trivia.syntax());
            else if (includePreprocessed) {
                for (const auto& t : trivia.syntax()->getFirstToken().trivia())
                    print(t);
            }
            break;
        case TriviaKind::SkippedSyntax:
            if (includeSkipped)
                print(*trivia.syntax());
            break;
        case TriviaKind::SkippedTokens:
            if (includeSkipped) {
                for (Token t : trivia.getSkippedTokens())
                    print(t);
            }
            break;
        case TriviaKind::LineComment:
        case TriviaKind::BlockComment:
            if (!includeComments)
                break;
            [[fallthrough]];
        default:
            append(trivia.getRawText());
            break;
    }
    return *this;
}